

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O1

void __thiscall DiskGen::Recalib(DiskGen *this)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar1;
  
  uVar1 = this->current_track_ - 0x4d;
  if (this->current_track_ < 0x4d) {
    uVar1 = 0;
  }
  this->current_track_ = uVar1;
  if (this->disk_present_ == true) {
    UNRECOVERED_JUMPTABLE = this->disk_->_vptr_IDisk[10];
    (*UNRECOVERED_JUMPTABLE)
              (this->disk_,(ulong)(uint)this->current_side_,(ulong)uVar1,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void DiskGen::Recalib()
{
   if (current_track_ > 77)
   {
      current_track_ -= 77;
   }
   else
   {
      current_track_ = 0;
   }
   if (disk_present_)
   {
      // Get next single bit
      disk_->ChangeTrack(current_side_, current_track_);
      ComputeSpeed(0);
   }
}